

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

CPAccessResult access_tpm(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  
  iVar1 = arm_current_el(env);
  if (iVar1 < 2) {
    if (((env->cp15).mdcr_el2 & 0x40) != 0) {
      if ((env->features & 0x200000000) == 0) {
        return CP_ACCESS_TRAP_EL2;
      }
      if (((env->cp15).scr_el3 & 1) != 0) {
        return CP_ACCESS_TRAP_EL2;
      }
    }
  }
  else if (iVar1 != 2) {
    return CP_ACCESS_OK;
  }
  if (((env->cp15).mdcr_el3 & 0x40) == 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_EL3;
}

Assistant:

static CPAccessResult access_tpm(CPUARMState *env, const ARMCPRegInfo *ri,
                                 bool isread)
{
    int el = arm_current_el(env);

    if (el < 2 && (env->cp15.mdcr_el2 & MDCR_TPM)
        && !arm_is_secure_below_el3(env)) {
        return CP_ACCESS_TRAP_EL2;
    }
    if (el < 3 && (env->cp15.mdcr_el3 & MDCR_TPM)) {
        return CP_ACCESS_TRAP_EL3;
    }
    return CP_ACCESS_OK;
}